

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_segment(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
             int notEmpty)

{
  size_t sVar1;
  _func_int_void_ptr_char_ptr_size_t *callback;
  curi_status cVar2;
  int iVar3;
  size_t sVar4;
  void *userData_00;
  size_t subOffset;
  size_t local_40;
  curi_settings *local_38;
  
  sVar1 = *offset;
  sVar4 = sVar1;
  userData_00 = userData;
  local_38 = settings;
  if (notEmpty != 0) {
    cVar2 = parse_pchar(uri,len,offset,settings,userData);
    if (cVar2 != curi_status_success) {
      return cVar2;
    }
    sVar4 = *offset;
  }
  while (local_40 = sVar4, cVar2 = parse_pchar(uri,len,&local_40,settings,userData_00),
        cVar2 == curi_status_success) {
    *offset = local_40;
    sVar4 = local_40;
  }
  callback = local_38->path_segment_callback;
  if (local_38->url_decode == 0) {
    cVar2 = curi_status_success;
    if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && sVar4 != sVar1) {
      iVar3 = (*callback)(userData,uri + sVar1,sVar4 - sVar1);
      cVar2 = (curi_status)(iVar3 == 0);
    }
    return cVar2;
  }
  cVar2 = handle_str_callback_url_decoded(callback,uri + sVar1,sVar4 - sVar1,local_38,userData);
  return cVar2;
}

Assistant:

static curi_status parse_segment(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int notEmpty)
{
    // segment = pchars
    // segment-not-empty = pchar pchars
    const size_t initialOffset = *offset;
    curi_status status = curi_status_success;

    if (notEmpty && status == curi_status_success)
        status = parse_pchar(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_pchars(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = handle_path_segment(uri + initialOffset, *offset - initialOffset, settings, userData);

    return status;
}